

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.tpl.h
# Opt level: O0

double __thiscall
r_exec::Object<r_code::LObject,_r_exec::LObject>::get_psln_thr
          (Object<r_code::LObject,_r_exec::LObject> *this)

{
  byte bVar1;
  undefined8 extraout_RDX;
  float fVar2;
  float r;
  lock_guard<std::mutex> guard;
  Object<r_code::LObject,_r_exec::LObject> *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe8,&this->m_pslnThrMutex);
  (*(this->super_LObject).super_Code.super__Object._vptr__Object[4])(this,0);
  bVar1 = r_code::Atom::getAtomCount();
  (*(this->super_LObject).super_Code.super__Object._vptr__Object[4])
            (this,(ulong)bVar1,extraout_RDX,bVar1);
  fVar2 = (float)r_code::Atom::asFloat();
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe8);
  return (double)fVar2;
}

Assistant:

double Object<C, U>::get_psln_thr()
{
    std::lock_guard<std::mutex> guard(m_pslnThrMutex);
    float r = this->code(this->code(0).getAtomCount()).asFloat(); // psln is always the last member of an object.
    return r;
}